

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

pool_ptr<soul::AST::Function> __thiscall soul::AST::Block::getParentFunction(Block *this)

{
  long in_RSI;
  
  if (*(_func_int ***)(in_RSI + 0x30) == (_func_int **)0x0) {
    Scope::getParentFunction((Scope *)this);
  }
  else {
    (this->super_Statement).super_ASTObject._vptr_ASTObject = *(_func_int ***)(in_RSI + 0x30);
  }
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<Function> getParentFunction() const override
        {
            if (isFunctionMainBlock())
                return functionForWhichThisIsMain;

            return Scope::getParentFunction();
        }